

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_identifier.h
# Opt level: O2

flatbuffers_thash_t read_thash_identifier(char *identifier)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = *identifier;
  uVar2 = (uint)bVar1;
  if (bVar1 != 0) {
    if (identifier[1] != '\0') {
      uVar2 = (uint)CONCAT11(identifier[1],bVar1);
      if (identifier[2] != 0) {
        uVar2 = uVar2 | (uint)(byte)identifier[3] << 0x18 | (uint)(byte)identifier[2] << 0x10;
      }
    }
    return uVar2;
  }
  return 0;
}

Assistant:

static inline flatbuffers_thash_t flatbuffers_type_hash_from_string(const char *identifier)
{
    flatbuffers_thash_t h = 0;
    const uint8_t *p = (const uint8_t *)identifier;

    if (!p[0]) return h;
    h += ((flatbuffers_thash_t)p[0]);
    if (!p[1]) return h;
    h += ((flatbuffers_thash_t)p[1]) << 8;
    if (!p[2]) return h;
    h += ((flatbuffers_thash_t)p[2]) << 16;
    /* No need to test for termination here. */
    h += ((flatbuffers_thash_t)p[3]) << 24;
    return h;
}